

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sar.c
# Opt level: O2

ErrorNumber test_func_sar(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  TA_Integer *pTVar3;
  uint nbElement;
  TA_Real *pTVar4;
  ulong uVar5;
  TA_Real *data;
  ulong uVar6;
  uint local_58;
  TA_Integer outBegIdx;
  ulong local_50;
  TA_History *local_48;
  TA_Real *local_40;
  TA_Real *local_38;
  
  local_48 = history;
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0x7c);
  pTVar3 = &tableTest[0].expectedNbElement;
  uVar6 = 0;
  do {
    if (uVar6 == 5) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
    if ((int)local_48->nbBars < *pTVar3) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_sar.c"
             ,uVar6 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    local_50 = uVar6;
    clearAllBuffers();
    pTVar4 = wilderHigh;
    data = wilderLow;
    nbElement = 0x26;
    if (((TA_Test_conflict13 *)(pTVar3 + -0xd))->useWilderData == 0) {
      pTVar4 = local_48->high;
      data = local_48->low;
      nbElement = local_48->nbBars;
    }
    setInputBuffer(0,pTVar4,nbElement);
    setInputBuffer(1,data,nbElement);
    TVar1 = TA_SAR(pTVar3[-0xc],pTVar3[-0xb],gBuffer[0].in,gBuffer[1].in,*(double *)(pTVar3 + -9),
                   *(double *)(pTVar3 + -7),&outBegIdx,(int *)&local_58,gBuffer[0].out0);
    local_38 = pTVar4;
    EVar2 = checkDataSame(gBuffer[0].in,pTVar4,nbElement);
    if ((EVar2 != TA_TEST_PASS) ||
       (local_40 = data, EVar2 = checkDataSame(gBuffer[1].in,data,nbElement), EVar2 != TA_TEST_PASS)
       ) goto LAB_0011af57;
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar3[-5],outBegIdx,pTVar3[-1],local_58,
                               *pTVar3,*(TA_Real *)(pTVar3 + -3),pTVar3[-4]);
    if (EVar2 != TA_TEST_PASS) {
LAB_0011af61:
      uVar6 = local_50;
      uVar5 = (ulong)EVar2;
      printf("Fail for output id=%d\n",0);
      goto LAB_0011afab;
    }
    local_58 = 0;
    outBegIdx = 0;
    TVar1 = TA_SAR(pTVar3[-0xc],pTVar3[-0xb],gBuffer[0].in,gBuffer[1].in,*(double *)(pTVar3 + -9),
                   *(double *)(pTVar3 + -7),&outBegIdx,(int *)&local_58,gBuffer[1].in);
    EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_0011af57;
    EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar3[-5],outBegIdx,pTVar3[-1],local_58,*pTVar3,
                               *(TA_Real *)(pTVar3 + -3),pTVar3[-4]);
    pTVar4 = local_38;
    if (EVar2 != TA_TEST_PASS) goto LAB_0011af61;
    EVar2 = checkDataSame(gBuffer[0].in,local_38,nbElement);
    if (EVar2 != TA_TEST_PASS) {
LAB_0011af57:
      uVar5 = (ulong)EVar2;
      uVar6 = local_50;
LAB_0011afab:
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_sar.c"
             ,uVar6 & 0xffffffff,uVar5);
      return (ErrorNumber)uVar5;
    }
    clearAllBuffers();
    setInputBuffer(0,pTVar4,nbElement);
    setInputBuffer(1,local_40,nbElement);
    TVar1 = TA_SAR(pTVar3[-0xc],pTVar3[-0xb],gBuffer[0].in,gBuffer[1].in,*(double *)(pTVar3 + -9),
                   *(double *)(pTVar3 + -7),&outBegIdx,(int *)&local_58,gBuffer[0].in);
    EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[0].in);
    if (EVar2 != TA_TEST_PASS) goto LAB_0011af57;
    EVar2 = checkExpectedValue(gBuffer[0].in,TVar1,pTVar3[-5],outBegIdx,pTVar3[-1],local_58,*pTVar3,
                               *(TA_Real *)(pTVar3 + -3),pTVar3[-4]);
    if (EVar2 != TA_TEST_PASS) goto LAB_0011af61;
    EVar2 = checkDataSame(gBuffer[1].in,local_40,nbElement);
    if (EVar2 != TA_TEST_PASS) {
      uVar5 = (ulong)EVar2;
      uVar6 = local_50;
      goto LAB_0011afab;
    }
    uVar6 = local_50 + 1;
    pTVar3 = pTVar3 + 0xe;
  } while( true );
}

Assistant:

ErrorNumber test_func_sar( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Set all the unstable period to a weird value. This is to make sure
    * that no unstable period affects the SAR.
    */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 124 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}